

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O2

void __thiscall
aeron::ExclusivePublication::ExclusivePublication
          (ExclusivePublication *this,ClientConductor *conductor,string *channel,
          int64_t registrationId,int64_t originalRegistrationId,int32_t streamId,int32_t sessionId,
          UnsafeBufferPosition *publicationLimit,int32_t channelStatusId,
          shared_ptr<aeron::LogBuffers> logBuffers)

{
  uint uVar1;
  uint8_t *puVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  pointer __p;
  pointer __p_00;
  int iVar5;
  long lVar6;
  long lVar7;
  _Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false> local_38;
  
  this->_vptr_ExclusivePublication = (_func_int **)&PTR__ExclusivePublication_00170ca0;
  this->m_conductor = conductor;
  this->m_logMetaDataBuffer =
       (AtomicBuffer *)
       ((logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_LogBuffers + 0xc);
  std::__cxx11::string::string((string *)&this->m_channel,(string *)channel);
  this->m_registrationId = registrationId;
  this->m_originalRegistrationId = originalRegistrationId;
  uVar1 = *(uint *)((logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_LogBuffers + 5);
  this->m_maxPossiblePosition = (long)(int)uVar1 << 0x1f;
  this->m_streamId = streamId;
  this->m_sessionId = sessionId;
  puVar2 = this->m_logMetaDataBuffer->m_buffer;
  this->m_initialTermId = *(int32_t *)(puVar2 + 0x108);
  this->m_maxPayloadLength = *(int *)(puVar2 + 0x110) + -0x20;
  iVar5 = 0x1000000;
  if ((int)uVar1 / 8 < 0x1000000) {
    iVar5 = (int)uVar1 / 8;
  }
  this->m_maxMessageLength = iVar5;
  iVar5 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
    }
  }
  this->m_positionBitsToShift = iVar5;
  this->m_activePartitionIndex = *(int *)(puVar2 + 0x18) % 3;
  concurrent::status::UnsafeBufferPosition::UnsafeBufferPosition
            (&(this->m_publicationLimit).m_impl,publicationLimit);
  this->m_channelStatusId = channelStatusId;
  (this->m_isClosed)._M_base._M_i = false;
  std::__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
             ,(__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2> *)
              logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->m_appenders[2]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  this->m_appenders[0]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  this->m_appenders[1]._M_t.
  super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
  .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>._M_head_impl
       = (ExclusiveTermAppender *)0x0;
  puVar2 = this->m_logMetaDataBuffer->m_buffer;
  (this->m_headerWriter).m_sessionId = *(int32_t *)(puVar2 + 0x14c);
  (this->m_headerWriter).m_streamId = *(int32_t *)(puVar2 + 0x150);
  lVar7 = 0;
  for (lVar6 = 0x18; lVar6 != 0x60; lVar6 = lVar6 + 0x18) {
    __p_00 = (pointer)operator_new(0x10);
    pp_Var3 = (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_LogBuffers;
    __p_00->m_termBuffer = (AtomicBuffer *)((long)pp_Var3 + lVar6);
    __p_00->m_tailAddr = (int64_t *)(pp_Var3[0xd] + lVar7);
    local_38._M_head_impl = (ExclusiveTermAppender *)0x0;
    std::
    __uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
    ::reset((__uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
             *)((long)&this->m_appenders[0]._M_t.
                       super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                       .
                       super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                       ._M_head_impl + lVar7),__p_00);
    std::
    unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
    ::~unique_ptr((unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   *)&local_38);
    lVar7 = lVar7 + 8;
  }
  uVar4 = **(ulong **)
            ((long)this->m_appenders[this->m_activePartitionIndex]._M_t.
                   super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                   .
                   super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
            + 8);
  this->m_termId = (int32_t)(uVar4 >> 0x20);
  iVar5 = *(int *)((logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_vptr_LogBuffers + 5);
  if ((long)(uVar4 & 0xffffffff) < (long)iVar5) {
    iVar5 = (int)uVar4;
  }
  this->m_termOffset = iVar5;
  this->m_termBeginPosition =
       ((long)uVar4 >> 0x20) - (long)this->m_initialTermId <<
       ((byte)this->m_positionBitsToShift & 0x3f);
  return;
}

Assistant:

ExclusivePublication::ExclusivePublication(
    ClientConductor &conductor,
    const std::string &channel,
    std::int64_t registrationId,
    std::int64_t originalRegistrationId,
    std::int32_t streamId,
    std::int32_t sessionId,
    UnsafeBufferPosition& publicationLimit,
    std::int32_t channelStatusId,
    std::shared_ptr<LogBuffers> logBuffers)
    :
    m_conductor(conductor),
    m_logMetaDataBuffer(logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX)),
    m_channel(channel),
    m_registrationId(registrationId),
    m_originalRegistrationId(originalRegistrationId),
    m_maxPossiblePosition(static_cast<int64_t>(logBuffers->atomicBuffer(0).capacity()) << 31),
    m_streamId(streamId),
    m_sessionId(sessionId),
    m_initialTermId(LogBufferDescriptor::initialTermId(m_logMetaDataBuffer)),
    m_maxPayloadLength(LogBufferDescriptor::mtuLength(m_logMetaDataBuffer) - DataFrameHeader::LENGTH),
    m_maxMessageLength(FrameDescriptor::computeMaxMessageLength(logBuffers->atomicBuffer(0).capacity())),
    m_positionBitsToShift(util::BitUtil::numberOfTrailingZeroes(logBuffers->atomicBuffer(0).capacity())),
    m_activePartitionIndex(LogBufferDescriptor::indexByTermCount(LogBufferDescriptor::activeTermCount(m_logMetaDataBuffer))),
    m_publicationLimit(publicationLimit),
    m_channelStatusId(channelStatusId),
    m_logBuffers(logBuffers),
    m_headerWriter(LogBufferDescriptor::defaultFrameHeader(m_logMetaDataBuffer))
{
    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        /*
         * TODO:
         * perhaps allow copy-construction and be able to move appenders and AtomicBuffers directly into Publication for
         * locality.
         */
        m_appenders[i] = std::unique_ptr<ExclusiveTermAppender>(new ExclusiveTermAppender(
            logBuffers->atomicBuffer(i),
            logBuffers->atomicBuffer(LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX),
            i));
    }

    const std::int64_t rawTail = m_appenders[m_activePartitionIndex]->rawTail();
    m_termId = LogBufferDescriptor::termId(rawTail);
    m_termOffset = LogBufferDescriptor::termOffset(rawTail, logBuffers->atomicBuffer(0).capacity());
    m_termBeginPosition = LogBufferDescriptor::computeTermBeginPosition(m_termId, m_positionBitsToShift, m_initialTermId);
}